

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * __thiscall CS248::Matrix4x4::inv(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  int i;
  long lVar42;
  double *pdVar43;
  long lVar44;
  Matrix4x4 *A;
  uint uVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dStack_2f0;
  double dStack_2b0;
  double dStack_2a0;
  double local_258;
  undefined8 uStack_250;
  double local_248;
  undefined8 uStack_240;
  double dStack_230;
  double dStack_220;
  double dStack_210;
  double dStack_200;
  double dStack_120;
  double dStack_100;
  double dStack_d0;
  double dStack_b0;
  double dStack_80;
  double dStack_50;
  double dStack_10;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  dVar1 = this->entries[1].x;
  dVar47 = -dVar1;
  dVar2 = this->entries[0].y;
  dVar3 = this->entries[0].z;
  dVar48 = -dVar2;
  dVar38 = this->entries[3].y;
  dVar39 = this->entries[3].z;
  dVar40 = this->entries[2].y;
  dVar41 = this->entries[2].z;
  uVar10 = this->entries[1].y;
  uVar11 = this->entries[1].z;
  dVar28 = -(double)uVar10;
  auVar12._8_4_ = (int)uVar10;
  auVar12._0_8_ = uVar11;
  auVar12._12_4_ = (int)((ulong)dVar28 >> 0x20);
  dVar4 = this->entries[0].x;
  dVar46 = -dVar4;
  dVar5 = this->entries[3].x;
  dVar6 = this->entries[2].x;
  dVar29 = -dVar6;
  uVar45 = (uint)((ulong)dVar5 >> 0x20) ^ 0x80000000;
  auVar13._8_4_ = SUB84(dVar5,0);
  auVar13._0_8_ = dVar29;
  auVar13._12_4_ = uVar45;
  auVar14._8_4_ = SUB84(dVar5,0);
  auVar14._0_8_ = uVar10;
  auVar14._12_4_ = uVar45;
  auVar15._8_4_ = SUB84(dVar38,0);
  auVar15._0_8_ = uVar11;
  auVar15._12_4_ = (int)((ulong)-dVar38 >> 0x20);
  auVar16._8_4_ = SUB84(dVar2,0);
  auVar16._0_8_ = uVar10;
  auVar16._12_4_ = (int)((ulong)dVar48 >> 0x20);
  auVar17._8_4_ = SUB84(dVar41 * dVar2,0);
  auVar17._0_8_ = dVar39 * dVar48;
  auVar17._12_4_ = (int)((ulong)(dVar41 * dVar2) >> 0x20);
  dVar7 = this->entries[2].w;
  dVar8 = this->entries[3].w;
  dVar30 = dVar28 * dVar3 * dVar8;
  dVar35 = dVar3 * (double)uVar10 * dVar7;
  auVar18._8_4_ = SUB84(dVar35,0);
  auVar18._0_8_ = dVar30;
  auVar18._12_4_ = (int)((ulong)dVar35 >> 0x20);
  auVar19._8_4_ = (int)uVar11;
  auVar19._0_8_ = dVar39;
  auVar19._12_4_ = (int)((ulong)uVar11 >> 0x20);
  auVar20._8_4_ = SUB84(dVar4,0);
  auVar20._0_8_ = dVar4;
  auVar20._12_4_ = (int)((ulong)dVar46 >> 0x20);
  dVar31 = dVar47 * dVar2 * dVar8;
  dVar35 = dVar2 * dVar1 * dVar7;
  auVar21._8_4_ = SUB84(dVar35,0);
  auVar21._0_8_ = dVar31;
  auVar21._12_4_ = (int)((ulong)dVar35 >> 0x20);
  dVar35 = this->entries[0].w;
  dVar9 = this->entries[1].w;
  dStack_2f0 = auVar13._8_8_;
  dVar32 = dVar46 * dVar38;
  auVar22._8_4_ = SUB84(dVar4 * dVar40,0);
  auVar22._0_8_ = dVar32;
  auVar22._12_4_ = (int)((ulong)(dVar4 * dVar40) >> 0x20);
  auVar23._8_4_ = SUB84(dVar2 * dVar39,0);
  auVar23._0_8_ = dVar28 * dVar39;
  auVar23._12_4_ = (int)((ulong)(dVar2 * dVar39) >> 0x20);
  dVar33 = dVar6 * (double)uVar10 * dVar39;
  dVar36 = dVar29 * dVar2 * dVar39;
  auVar24._8_4_ = SUB84(dVar36,0);
  auVar24._0_8_ = dVar33;
  auVar24._12_4_ = (int)((ulong)dVar36 >> 0x20);
  dStack_200 = auVar22._8_8_;
  dVar36 = dVar47 * dVar40 * dVar39;
  auVar25._8_4_ = SUB84(dStack_200 * dVar39,0);
  auVar25._0_8_ = dVar36;
  auVar25._12_4_ = (int)((ulong)(dStack_200 * dVar39) >> 0x20);
  dStack_230 = auVar16._8_8_;
  dVar34 = dVar41 * dVar47 * dVar8 +
           dVar6 * (double)uVar11 * dVar8 +
           dVar39 * dVar1 * dVar7 +
           (double)uVar11 * dStack_2f0 * dVar7 + (dVar41 * dVar5 * dVar9 - dVar9 * dVar39 * dVar6);
  dVar37 = dVar41 * dVar4 * dVar8 +
           dVar3 * dVar29 * dVar8 +
           dVar39 * dVar46 * dVar7 +
           dVar5 * dVar3 * dVar7 + (dVar39 * dVar6 * dVar35 - dVar35 * dVar41 * dVar5);
  auVar26._8_4_ = SUB84(dVar37,0);
  auVar26._0_8_ = dVar34;
  auVar26._12_4_ = (int)((ulong)dVar37 >> 0x20);
  __return_storage_ptr__->entries[1].x = dVar34;
  __return_storage_ptr__->entries[1].y = (double)auVar26._8_8_;
  uStack_250._0_4_ = SUB84(dVar40,0);
  local_258 = (double)uVar11;
  uStack_250._4_4_ = (int)((ulong)dVar40 >> 0x20);
  uStack_240._0_4_ = SUB84(dVar41,0);
  local_248 = (double)uVar11;
  uStack_240._4_4_ = (int)((ulong)dVar41 >> 0x20);
  dStack_d0 = auVar14._8_8_;
  __return_storage_ptr__->entries[2].x =
       dVar40 * dVar1 * dVar8 +
       dVar29 * (double)uVar10 * dVar8 +
       dVar38 * dVar47 * dVar7 +
       (double)uVar10 * dVar5 * dVar7 + dVar9 * dVar6 * dVar38 + dVar40 * dStack_2f0 * dVar9;
  __return_storage_ptr__->entries[2].y =
       dVar40 * dVar46 * dVar8 +
       dVar2 * dVar6 * dVar8 +
       dVar38 * dVar4 * dVar7 +
       dStack_d0 * dVar2 * dVar7 + dVar35 * dVar5 * dVar40 + dVar38 * dVar29 * dVar35;
  dStack_b0 = auVar15._8_8_;
  dStack_210 = auVar23._8_8_;
  dVar28 = (double)uVar10 * dVar41 * dVar8 +
           (double)uVar11 * -dVar40 * dVar8 +
           dVar28 * dVar39 * dVar7 +
           (double)uVar11 * dVar38 * dVar7 + (dVar39 * dVar40 * dVar9 - dVar41 * dVar38 * dVar9);
  dVar34 = dStack_230 * dVar41 * dVar8 +
           uStack_250 * dVar3 * dVar8 +
           dStack_210 * dVar7 +
           dStack_b0 * dVar3 * dVar7 + (dVar38 * dVar41 * dVar35 - dVar39 * dVar40 * dVar35);
  auVar27._8_4_ = SUB84(dVar34,0);
  auVar27._0_8_ = dVar28;
  auVar27._12_4_ = (int)((ulong)dVar34 >> 0x20);
  __return_storage_ptr__->entries[0].x = dVar28;
  __return_storage_ptr__->entries[0].y = (double)auVar27._8_8_;
  dStack_10 = auVar12._8_8_;
  dStack_50 = auVar17._8_8_;
  dStack_220 = auVar18._8_8_;
  __return_storage_ptr__->entries[0].z =
       dVar2 * (double)uVar11 * dVar8 +
       dVar30 + dVar39 * dVar48 * dVar9 +
                dVar38 * dVar3 * dVar9 +
                dVar39 * (double)uVar10 * dVar35 + -dVar38 * (double)uVar11 * dVar35;
  __return_storage_ptr__->entries[0].w =
       dVar48 * (double)uVar11 * dVar7 +
       dStack_220 +
       dStack_50 * dVar9 +
       -dVar40 * dVar3 * dVar9 + dVar40 * (double)uVar11 * dVar35 + dVar41 * dStack_10 * dVar35;
  dStack_80 = auVar19._8_8_;
  dStack_120 = auVar20._8_8_;
  __return_storage_ptr__->entries[1].z =
       (double)uVar11 * dVar46 * dVar8 +
       dVar3 * dVar1 * dVar8 +
       dVar39 * dVar4 * dVar9 +
       dVar3 * dStack_2f0 * dVar9 + dVar5 * (double)uVar11 * dVar35 + dVar47 * dVar39 * dVar35;
  __return_storage_ptr__->entries[1].w =
       (double)uVar11 * dVar4 * dVar7 +
       dVar47 * dVar3 * dVar7 +
       dVar41 * dStack_120 * dVar9 +
       dVar6 * dVar3 * dVar9 + dVar1 * uStack_240 * dVar35 + dVar29 * dStack_80 * dVar35;
  dStack_2a0 = auVar24._8_8_;
  dStack_2b0 = auVar25._8_8_;
  __return_storage_ptr__->entries[3].x =
       dVar36 + dVar33 + dVar1 * dVar38 * dVar41 +
                         dStack_2f0 * (double)uVar10 * dVar41 +
                         (double)uVar11 * dVar5 * dVar40 + dVar38 * dVar29 * (double)uVar11;
  __return_storage_ptr__->entries[3].y =
       dStack_2b0 +
       dStack_2a0 +
       dVar32 * dVar41 +
       dVar2 * dVar5 * dVar41 + dVar3 * dVar6 * dVar38 + dVar40 * dStack_2f0 * dVar3;
  dStack_100 = auVar21._8_8_;
  __return_storage_ptr__->entries[2].z =
       dVar8 * (double)uVar10 * dVar4 +
       dVar31 + dVar32 * dVar9 +
                dVar2 * dVar5 * dVar9 +
                dVar1 * dVar38 * dVar35 + dStack_2f0 * (double)uVar10 * dVar35;
  __return_storage_ptr__->entries[2].w =
       dVar7 * (double)uVar10 * dVar46 +
       dStack_100 +
       dStack_200 * dVar9 +
       dVar29 * dVar2 * dVar9 + dVar6 * (double)uVar10 * dVar35 + dVar47 * dVar40 * dVar35;
  __return_storage_ptr__->entries[3].z =
       (double)uVar10 * dVar46 * dVar39 +
       dVar2 * dVar1 * dVar39 +
       dVar38 * dVar4 * (double)uVar11 +
       dStack_d0 * dVar2 * (double)uVar11 + (double)uVar10 * dVar5 * dVar3 + dVar38 * dVar47 * dVar3
  ;
  __return_storage_ptr__->entries[3].w =
       (double)uVar10 * dVar4 * dVar41 +
       dVar47 * dVar2 * dVar41 +
       dVar40 * dVar46 * (double)uVar11 +
       dVar2 * dVar6 * (double)uVar11 + dVar40 * dVar1 * dVar3 + dVar29 * (double)uVar10 * dVar3;
  dVar1 = det(this);
  lVar42 = 0;
  pdVar43 = (double *)__return_storage_ptr__;
  do {
    lVar44 = 0;
    do {
      *(double *)((long)pdVar43 + lVar44) = *(double *)((long)pdVar43 + lVar44) * (1.0 / dVar1);
      lVar44 = lVar44 + 0x20;
    } while (lVar44 != 0x80);
    lVar42 = lVar42 + 1;
    pdVar43 = pdVar43 + 1;
  } while (lVar42 != 4);
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 Matrix4x4::inv( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

	// Hardcoded in Fully Symbolic computation.

	B(0,0) = A(1,2)*A(2,3)*A(3,1) - A(1,3)*A(2,2)*A(3,1) + A(1,3)*A(2,1)*A(3,2) - A(1,1)*A(2,3)*A(3,2) - A(1,2)*A(2,1)*A(3,3) + A(1,1)*A(2,2)*A(3,3);
	B(0,1) = A(0,3)*A(2,2)*A(3,1) - A(0,2)*A(2,3)*A(3,1) - A(0,3)*A(2,1)*A(3,2) + A(0,1)*A(2,3)*A(3,2) + A(0,2)*A(2,1)*A(3,3) - A(0,1)*A(2,2)*A(3,3);
	B(0,2) = A(0,2)*A(1,3)*A(3,1) - A(0,3)*A(1,2)*A(3,1) + A(0,3)*A(1,1)*A(3,2) - A(0,1)*A(1,3)*A(3,2) - A(0,2)*A(1,1)*A(3,3) + A(0,1)*A(1,2)*A(3,3);
	B(0,3) = A(0,3)*A(1,2)*A(2,1) - A(0,2)*A(1,3)*A(2,1) - A(0,3)*A(1,1)*A(2,2) + A(0,1)*A(1,3)*A(2,2) + A(0,2)*A(1,1)*A(2,3) - A(0,1)*A(1,2)*A(2,3);
	B(1,0) = A(1,3)*A(2,2)*A(3,0) - A(1,2)*A(2,3)*A(3,0) - A(1,3)*A(2,0)*A(3,2) + A(1,0)*A(2,3)*A(3,2) + A(1,2)*A(2,0)*A(3,3) - A(1,0)*A(2,2)*A(3,3);
	B(1,1) = A(0,2)*A(2,3)*A(3,0) - A(0,3)*A(2,2)*A(3,0) + A(0,3)*A(2,0)*A(3,2) - A(0,0)*A(2,3)*A(3,2) - A(0,2)*A(2,0)*A(3,3) + A(0,0)*A(2,2)*A(3,3);
	B(1,2) = A(0,3)*A(1,2)*A(3,0) - A(0,2)*A(1,3)*A(3,0) - A(0,3)*A(1,0)*A(3,2) + A(0,0)*A(1,3)*A(3,2) + A(0,2)*A(1,0)*A(3,3) - A(0,0)*A(1,2)*A(3,3);
	B(1,3) = A(0,2)*A(1,3)*A(2,0) - A(0,3)*A(1,2)*A(2,0) + A(0,3)*A(1,0)*A(2,2) - A(0,0)*A(1,3)*A(2,2) - A(0,2)*A(1,0)*A(2,3) + A(0,0)*A(1,2)*A(2,3);
	B(2,0) = A(1,1)*A(2,3)*A(3,0) - A(1,3)*A(2,1)*A(3,0) + A(1,3)*A(2,0)*A(3,1) - A(1,0)*A(2,3)*A(3,1) - A(1,1)*A(2,0)*A(3,3) + A(1,0)*A(2,1)*A(3,3);
	B(2,1) = A(0,3)*A(2,1)*A(3,0) - A(0,1)*A(2,3)*A(3,0) - A(0,3)*A(2,0)*A(3,1) + A(0,0)*A(2,3)*A(3,1) + A(0,1)*A(2,0)*A(3,3) - A(0,0)*A(2,1)*A(3,3);
	B(2,2) = A(0,1)*A(1,3)*A(3,0) - A(0,3)*A(1,1)*A(3,0) + A(0,3)*A(1,0)*A(3,1) - A(0,0)*A(1,3)*A(3,1) - A(0,1)*A(1,0)*A(3,3) + A(0,0)*A(1,1)*A(3,3);
	B(2,3) = A(0,3)*A(1,1)*A(2,0) - A(0,1)*A(1,3)*A(2,0) - A(0,3)*A(1,0)*A(2,1) + A(0,0)*A(1,3)*A(2,1) + A(0,1)*A(1,0)*A(2,3) - A(0,0)*A(1,1)*A(2,3);
	B(3,0) = A(1,2)*A(2,1)*A(3,0) - A(1,1)*A(2,2)*A(3,0) - A(1,2)*A(2,0)*A(3,1) + A(1,0)*A(2,2)*A(3,1) + A(1,1)*A(2,0)*A(3,2) - A(1,0)*A(2,1)*A(3,2);
	B(3,1) = A(0,1)*A(2,2)*A(3,0) - A(0,2)*A(2,1)*A(3,0) + A(0,2)*A(2,0)*A(3,1) - A(0,0)*A(2,2)*A(3,1) - A(0,1)*A(2,0)*A(3,2) + A(0,0)*A(2,1)*A(3,2);
	B(3,2) = A(0,2)*A(1,1)*A(3,0) - A(0,1)*A(1,2)*A(3,0) - A(0,2)*A(1,0)*A(3,1) + A(0,0)*A(1,2)*A(3,1) + A(0,1)*A(1,0)*A(3,2) - A(0,0)*A(1,1)*A(3,2);
	B(3,3) = A(0,1)*A(1,2)*A(2,0) - A(0,2)*A(1,1)*A(2,0) + A(0,2)*A(1,0)*A(2,1) - A(0,0)*A(1,2)*A(2,1) - A(0,1)*A(1,0)*A(2,2) + A(0,0)*A(1,1)*A(2,2);

	// Invertable iff the determinant is not equal to zero.
    B /= det();

    return B;
  }